

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool perfetto::anon_unknown_4::NameMatchesFilter
               (string *name,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *name_filter,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *name_regex_filter)

{
  pointer pbVar1;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool bVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  long lVar6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  long lVar8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  string *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  pbVar1 = (name_filter->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (name_filter->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((pbVar1 == pbVar2) &&
     ((name_regex_filter->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (name_regex_filter->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    return true;
  }
  _Var5 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (pbVar1,pbVar2,name);
  pbVar3 = (name_filter->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  __it._M_current =
       (name_regex_filter->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (name_regex_filter->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)local_38 - (long)__it._M_current;
  local_40 = name;
  for (lVar6 = lVar8 >> 7; _Var7._M_current = __it._M_current, 0 < lVar6; lVar6 = lVar6 + -1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
            ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                          *)&local_40,__it);
    if (bVar4) goto LAB_002f9e26;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
            ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                          *)&local_40,__it._M_current + 1);
    _Var7._M_current = __it._M_current + 1;
    if (bVar4) goto LAB_002f9e26;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
            ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                          *)&local_40,__it._M_current + 2);
    _Var7._M_current = __it._M_current + 2;
    if (bVar4) goto LAB_002f9e26;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
            ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                          *)&local_40,__it._M_current + 3);
    _Var7._M_current = __it._M_current + 3;
    if (bVar4) goto LAB_002f9e26;
    __it._M_current = __it._M_current + 4;
    lVar8 = lVar8 + -0x80;
  }
  lVar8 = lVar8 >> 5;
  if (lVar8 != 1) {
    if (lVar8 != 2) {
      _Var7._M_current = local_38;
      if ((lVar8 != 3) ||
         (bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
                  ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                                *)&local_40,__it), _Var7._M_current = __it._M_current, bVar4))
      goto LAB_002f9e26;
      _Var7._M_current = __it._M_current + 1;
    }
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
            ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                          *)&local_40,_Var7);
    if (bVar4) goto LAB_002f9e26;
    __it._M_current = _Var7._M_current + 1;
  }
  bVar4 = __gnu_cxx::__ops::
          _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
          ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                        *)&local_40,__it);
  _Var7._M_current = local_38;
  if (bVar4) {
    _Var7._M_current = __it._M_current;
  }
LAB_002f9e26:
  return _Var7._M_current !=
         (name_regex_filter->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish || _Var5._M_current != pbVar3;
}

Assistant:

bool NameMatchesFilter(const std::string& name,
                       const std::vector<std::string>& name_filter,
                       const std::vector<std::string>& name_regex_filter) {
  bool filter_is_set = !name_filter.empty() || !name_regex_filter.empty();
  if (!filter_is_set)
    return true;
  bool filter_matches = std::find(name_filter.begin(), name_filter.end(),
                                  name) != name_filter.end();
  bool filter_regex_matches =
      std::find_if(name_regex_filter.begin(), name_regex_filter.end(),
                   [&](const std::string& regex) {
                     return std::regex_match(
                         name, std::regex(regex, std::regex::extended));
                   }) != name_regex_filter.end();
  return filter_matches || filter_regex_matches;
}